

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O0

int __thiscall
glcts::TextureCubeMapArraySamplingTest::link
          (TextureCubeMapArraySamplingTest *this,char *__from,char *__to)

{
  GLuint GVar1;
  int iVar2;
  uint uVar3;
  int extraout_EAX;
  char *__to_00;
  char *__from_00;
  programDefinition *info_local;
  TextureCubeMapArraySamplingTest *this_local;
  
  this->linked_programs = this->linked_programs + 1;
  __from_00 = __from;
  GVar1 = programDefinition::getProgramId((programDefinition *)__from);
  iVar2 = 0;
  if (GVar1 != 0) {
    uVar3 = programDefinition::link((programDefinition *)__from,__from_00,__to_00);
    iVar2 = 0;
    if ((uVar3 & 1) == 0) {
      this->invalid_programs = this->invalid_programs + 1;
      logLinkingLog(this,(programDefinition *)__from);
      logProgram(this,(programDefinition *)__from);
      iVar2 = extraout_EAX;
    }
  }
  return iVar2;
}

Assistant:

void TextureCubeMapArraySamplingTest::link(programDefinition& info)
{
	linked_programs += 1;

	/* Not supported format */
	if (programDefinition::m_invalid_program_object_id == info.getProgramId())
	{
		return;
	}

	if (false == info.link())
	{
		invalid_programs += 1;

		logLinkingLog(info);
		logProgram(info);
	}
}